

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::SampleMeanWithWeighting
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *__x;
  _Rb_tree_header *p_Var1;
  int *__k;
  undefined1 *__k_00;
  int iVar2;
  pointer pmVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  undefined4 uVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  long *plVar13;
  code *pcVar14;
  _Base_ptr p_Var15;
  undefined4 in_register_0000000c;
  int *piVar16;
  float fVar17;
  int in_stack_00000008;
  pair<const_summary_id_period_key,_lossval> s;
  pair<const_outkey2,_OutLosses> x_1;
  undefined4 uStack_f4;
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  mean_map;
  map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
  items;
  key_type local_68;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  unusedperiodstoweighting;
  
  if (this->samplesize_ != 0) {
    items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &items._M_t._M_impl.super__Rb_tree_header._M_header;
    items._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __x = &this->periodstoweighting_;
    items._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::_Rb_tree(&unusedperiodstoweighting._M_t,&__x->_M_t);
    pmVar3 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    __k_00 = &mean_map._M_t._M_impl.field_0x4;
    p_Var1 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
    plVar13 = (long *)(&mean_map._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 +
                      CONCAT44(in_register_0000000c,epcalc));
    for (p_Var10 = *(_Base_ptr *)((long)&pmVar3[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var10 != &pmVar3[1]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           CONCAT44(mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                    *(undefined4 *)&p_Var10[1]._M_left);
      s.first.summary_id = p_Var10[1]._M_color;
      s.first.period_no = *(int *)&p_Var10[1].field_0x4;
      mean_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = p_Var10[1]._M_parent;
      mean_map._M_t._M_impl._0_8_ = s.first;
      iVar8 = std::
              _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              ::find(&__x->_M_t,(key_type *)__k_00);
      if ((_Rb_tree_header *)iVar8._M_node != p_Var1) {
        p_Var12 = iVar8._M_node[1]._M_parent;
        pmVar9 = std::
                 map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                 ::operator[](&items,&s.first);
        pmVar9->period_weighting = (double)p_Var12;
        uVar7 = mean_map._M_t._M_impl._4_4_;
        pmVar9 = std::
                 map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                 ::operator[](&items,&s.first);
        pmVar9->period_no = uVar7;
        pcVar14 = (code *)GetOutLoss;
        if ((GetOutLoss & 1) != 0) {
          pcVar14 = *(code **)(*plVar13 + -1 + GetOutLoss);
        }
        fVar17 = (float)(*pcVar14)(plVar13);
        iVar2 = this->samplesize_;
        pmVar9 = std::
                 map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                 ::operator[](&items,&s.first);
        pmVar9->value = fVar17 / (float)iVar2 + pmVar9->value;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::erase(&unusedperiodstoweighting._M_t,(key_type *)__k_00);
    }
    mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &mean_map._M_t._M_impl.super__Rb_tree_header._M_header;
    mean_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         mean_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    mean_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var12 = items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var12 != &items._M_t._M_impl.super__Rb_tree_header;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
      s.first.summary_id = p_Var12[1]._M_color;
      s.first.period_no = *(int *)&p_Var12[1].field_0x4;
      s.second._0_8_ = p_Var12[1]._M_parent;
      s.second.period_weighting = (double)p_Var12[1]._M_left;
      s.second._16_8_ = p_Var12[1]._M_right;
      pmVar11 = std::
                map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                ::operator[](&mean_map,(key_type *)&s);
      std::vector<lossval,_std::allocator<lossval>_>::push_back(pmVar11,&s.second);
    }
    WriteExceedanceProbabilityTable
              (this,fileIDs,&mean_map,(float)this->samplesize_,eptype,eptype_tvar,in_stack_00000008,
               &unusedperiodstoweighting,1);
    if ((this->ordFlag_ == false) &&
       ((this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      __k = &x_1.first.period_no;
      plVar13 = (long *)((long)&x_1.second.agg_out_loss + CONCAT44(in_register_0000000c,epcalc));
      for (p_Var12 = (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var12 != &(this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header;
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
        std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair
                  ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&s,
                   (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)(p_Var12 + 1));
        std::
        _Rb_tree<summary_id_period_key,_std::pair<const_summary_id_period_key,_lossval>,_std::_Select1st<std::pair<const_summary_id_period_key,_lossval>_>,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
        ::clear(&items._M_t);
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::operator=(&unusedperiodstoweighting._M_t,&__x->_M_t);
        pmVar3 = (this->out_loss_->
                 super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        for (p_Var10 = *(_Base_ptr *)((long)&pmVar3[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
            dVar5 = s.second.period_weighting,
            p_Var10 != &pmVar3[1]._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
          stack0xffffffffffffff08 =
               (_Base_ptr)CONCAT44(uStack_f4,*(undefined4 *)&p_Var10[1]._M_left);
          x_1.first.summary_id = p_Var10[1]._M_color;
          x_1.first.period_no = *(int *)&p_Var10[1].field_0x4;
          x_1._8_8_ = p_Var10[1]._M_parent;
          for (piVar16 = (int *)s.second._0_8_; piVar16 != (int *)dVar5; piVar16 = piVar16 + 1) {
            if (x_1.first.sidx == *piVar16) {
              local_68.summary_id = x_1.first.summary_id;
              local_68.period_no = x_1.first.period_no;
              iVar8 = std::
                      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                      ::find(&__x->_M_t,__k);
              if ((_Rb_tree_header *)iVar8._M_node != p_Var1) {
                p_Var15 = iVar8._M_node[1]._M_parent;
                pmVar9 = std::
                         map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                         ::operator[](&items,&local_68);
                pmVar9->period_weighting = (double)p_Var15;
                iVar2 = x_1.first.period_no;
                pmVar9 = std::
                         map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                         ::operator[](&items,&local_68);
                pmVar9->period_no = iVar2;
                pcVar14 = (code *)GetOutLoss;
                if ((GetOutLoss & 1) != 0) {
                  pcVar14 = *(code **)(*plVar13 + -1 + GetOutLoss);
                }
                fVar17 = (float)(*pcVar14)(plVar13);
                dVar6 = s.second.period_weighting;
                uVar4 = s.second._0_8_;
                pmVar9 = std::
                         map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                         ::operator[](&items,&local_68);
                pmVar9->value = fVar17 / (float)(ulong)((long)dVar6 - uVar4 >> 2) + pmVar9->value;
              }
              std::
              _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              ::erase(&unusedperiodstoweighting._M_t,__k);
            }
          }
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
        ::clear(&mean_map._M_t);
        for (p_Var15 = items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var15 != &items._M_t._M_impl.super__Rb_tree_header;
            p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15)) {
          x_1.first.summary_id = p_Var15[1]._M_color;
          x_1.first.period_no = *(int *)&p_Var15[1].field_0x4;
          x_1._8_8_ = p_Var15[1]._M_parent;
          unique0x10000501 = p_Var15[1]._M_left;
          pmVar11 = std::
                    map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                    ::operator[](&mean_map,(key_type *)&x_1);
          std::vector<lossval,_std::allocator<lossval>_>::push_back
                    (pmVar11,(value_type *)&x_1.first.sidx);
        }
        WriteExceedanceProbabilityTable
                  (this,fileIDs,&mean_map,(float)this->samplesize_,eptype,s.first.summary_id,
                   in_stack_00000008,&unusedperiodstoweighting,1);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&s.second);
      }
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
    ::~_Rb_tree(&mean_map._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&unusedperiodstoweighting._M_t);
    std::
    _Rb_tree<summary_id_period_key,_std::pair<const_summary_id_period_key,_lossval>,_std::_Select1st<std::pair<const_summary_id_period_key,_lossval>_>,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
    ::~_Rb_tree(&items._M_t);
  }
  return;
}

Assistant:

void aggreports::SampleMeanWithWeighting(const std::vector<int> &fileIDs,
	OASIS_FLOAT (OutLosses::*GetOutLoss)(), const int epcalc,
	const int eptype, const int eptype_tvar) {

  if (samplesize_ == 0) return;   // Prevent division by zero error

  std::map<summary_id_period_key, lossval> items;
  std::map<int, double> unusedperiodstoweighting = periodstoweighting_;

  for (auto x : (*out_loss_)[SAMPLES]) {
    summary_id_period_key sk;
    sk.summary_id = x.first.summary_id;
    sk.period_no = x.first.period_no;
    auto iter = periodstoweighting_.find(x.first.period_no);
    if (iter != periodstoweighting_.end()) {
      items[sk].period_weighting = iter->second;
      items[sk].period_no = x.first.period_no;   // for debugging
      items[sk].value += ((x.second.*GetOutLoss)() / samplesize_);
    }
    unusedperiodstoweighting.erase(x.first.period_no);
  }

  std::map<int, lossvec2> mean_map;
  for (auto s : items) {
    mean_map[s.first.summary_id].push_back(s.second);
  }

  WriteExceedanceProbabilityTable(fileIDs, mean_map, samplesize_, epcalc,
				  eptype, eptype_tvar,
				  unusedperiodstoweighting);

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      items.clear();
      unusedperiodstoweighting = periodstoweighting_;
      for (auto x : (*out_loss_)[SAMPLES]) {
	for (auto sidx : ensemble.second) {
	  if (x.first.sidx == sidx) {
	    summary_id_period_key sk;
	    sk.summary_id = x.first.summary_id;
	    sk.period_no = x.first.period_no;
	    auto iter = periodstoweighting_.find(x.first.period_no);
	    if (iter != periodstoweighting_.end()) {
	      items[sk].period_weighting = iter->second;
	      items[sk].period_no = x.first.period_no;   // for debugging
	      items[sk].value += ((x.second.*GetOutLoss)() / ensemble.second.size());
	    }
	    unusedperiodstoweighting.erase(x.first.period_no);
	  }
	}
      }
      mean_map.clear();
      for (auto s : items) {
	mean_map[s.first.summary_id].push_back(s.second);
      }
      WriteExceedanceProbabilityTable(fileIDs, mean_map, samplesize_,
				      epcalc, ensemble.first, eptype_tvar,
				      unusedperiodstoweighting, 1);
    }
  }
}